

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O3

void cppurses::detail::Screen::paint_empty_tiles(Widget *widg)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  size_t y;
  size_t y_00;
  size_t sVar8;
  size_t x;
  Glyph wallpaper;
  Screen_mask local_90;
  Glyph local_48;
  
  if ((widg->children).children_.
      super__Vector_base<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>,_std::allocator<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (widg->children).children_.
      super__Vector_base<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>,_std::allocator<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    Widget::generate_wallpaper(&local_48,widg);
    find_empty_space(&local_90,widg);
    sVar2 = local_90.area_.width;
    sVar1 = local_90.offset_.x;
    uVar3 = local_90.area_.height + local_90.offset_.y;
    if (local_90.offset_.y < uVar3) {
      uVar4 = local_90.offset_.x + local_90.area_.width;
      y_00 = local_90.offset_.y;
      do {
        sVar8 = sVar2;
        x = sVar1;
        if (sVar1 < uVar4) {
          do {
            lVar5 = (y_00 - local_90.offset_.y) * local_90.area_.width - local_90.offset_.x;
            uVar7 = x + lVar5;
            uVar6 = x + 0x3f + lVar5;
            if (-1 < (long)uVar7) {
              uVar6 = uVar7;
            }
            if ((local_90.bits_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [((long)uVar6 >> 6) +
                  ((ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
                 (uVar7 & 0x3f) & 1) != 0) {
              output::move_cursor(x,y_00);
              output::put(&local_48);
            }
            x = x + 1;
            sVar8 = sVar8 - 1;
          } while (sVar8 != 0);
        }
        y_00 = y_00 + 1;
      } while (y_00 != uVar3);
    }
    if (local_90.bits_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_90.bits_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_90.bits_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_90.bits_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
  }
  return;
}

Assistant:

void Screen::paint_empty_tiles(const Widget& widg)
{
    if (!has_children(widg)) {
        return;
    }
    const auto wallpaper   = widg.generate_wallpaper();
    const auto empty_space = find_empty_space(widg);
    const auto y_begin     = empty_space.offset().y;
    const auto x_begin     = empty_space.offset().x;
    const auto y_end       = y_begin + empty_space.area().height;
    const auto x_end       = x_begin + empty_space.area().width;
    for (auto y = y_begin; y < y_end; ++y) {
        for (auto x = x_begin; x < x_end; ++x) {
            if (empty_space.at(x, y)) {
                output::put(x, y, wallpaper);
            }
        }
    }
}